

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

int Ppmd8_DecodeSymbol(CPpmd8 *p)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  Byte *pBVar4;
  CPpmd_State *pCVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  CPpmd_See *pCVar10;
  uint uVar11;
  long *plVar12;
  byte *pbVar13;
  ulong uVar14;
  uint unaff_EBP;
  uint uVar15;
  UInt32 UVar16;
  CPpmd8_Context *pCVar17;
  ulong uVar18;
  uint uVar19;
  UInt16 *pUVar20;
  uint uVar21;
  byte *pbVar22;
  UInt32 freqSum;
  size_t charMask [32];
  CPpmd_State *ps [256];
  uint local_940;
  uint local_93c;
  char local_938 [256];
  long local_838 [257];
  
  pCVar17 = p->MinContext;
  uVar11 = (uint)pCVar17->NumStats;
  if (pCVar17->NumStats == 0) {
    pUVar20 = p->BinSumm[p->NS2Indx[(ulong)*(byte *)((long)&pCVar17->SummFreq + 1) - 1]] +
              (((uint)p->RunLength >> 0x1a & 0xffffffe0) + (uint)pCVar17->Flags +
              (uint)p->NS2BSIndx[p->Base[pCVar17->Suffix]] + p->PrevSuccess);
    uVar11 = p->Range >> 0xe;
    p->Range = uVar11;
    uVar11 = p->Code / uVar11;
    uVar3 = *pUVar20;
    uVar19 = (uint)uVar3;
    if (uVar11 < uVar3) {
      RangeDec_Decode(p,0,uVar19);
      *pUVar20 = (*pUVar20 - (short)(*pUVar20 + 0x20 >> 7)) + 0x80;
      pCVar17 = p->MinContext;
      p->FoundState = (CPpmd_State *)&pCVar17->SummFreq;
      unaff_EBP = (uint)(byte)pCVar17->SummFreq;
      bVar1 = *(byte *)((long)&pCVar17->SummFreq + 1);
      *(byte *)((long)&pCVar17->SummFreq + 1) = bVar1 + (bVar1 < 0xc4);
      p->PrevSuccess = 1;
      p->RunLength = p->RunLength + 1;
      NextContext(p);
    }
    else {
      RangeDec_Decode(p,uVar19,0x4000 - uVar3);
      uVar7 = (uint)*pUVar20 - (*pUVar20 + 0x20 >> 7);
      *pUVar20 = (ushort)uVar7;
      p->InitEsc = (uint)"\x19\x0e\t\a\x05\x05\x04\x04\x04\x03\x03\x03\x02\x02\x02\x02"
                         [(uVar7 & 0xffff) >> 10];
      memset(local_938,0xff,0x100);
      local_938[(byte)p->MinContext->SummFreq] = '\0';
      p->PrevSuccess = 0;
    }
    local_93c = unaff_EBP;
    if (uVar11 < uVar19) {
      return unaff_EBP;
    }
  }
  else {
    pBVar4 = p->Base;
    uVar18 = (ulong)pCVar17->Stats;
    uVar3 = pCVar17->SummFreq;
    uVar14 = (ulong)p->Range / (ulong)uVar3;
    p->Range = (UInt32)uVar14;
    bVar1 = pBVar4[uVar18 + 1];
    uVar19 = (uint)(p->Code / uVar14);
    if (uVar19 < bVar1) {
      bVar6 = false;
      RangeDec_Decode(p,0,(uint)bVar1);
      p->FoundState = (CPpmd_State *)(pBVar4 + uVar18);
      bVar1 = ((CPpmd_State *)(pBVar4 + uVar18))->Symbol;
      Ppmd8_Update1_0(p);
      local_93c = (uint)bVar1;
    }
    else {
      p->PrevSuccess = 0;
      pbVar13 = pBVar4 + (uVar18 - 6);
      uVar7 = (uint)bVar1;
      do {
        pbVar22 = pbVar13;
        UVar16 = uVar7 + pbVar22[0xd];
        if (uVar19 < UVar16) {
          RangeDec_Decode(p,uVar7,(uint)pbVar22[0xd]);
          p->FoundState = (CPpmd_State *)(pbVar22 + 0xc);
          bVar1 = pbVar22[0xc];
          Ppmd8_Update1(p);
          local_93c = (uint)bVar1;
          goto LAB_00189e2e;
        }
        pbVar13 = pbVar22 + 6;
        uVar11 = uVar11 - 1;
        uVar7 = UVar16;
      } while (uVar11 != 0);
      if (uVar19 < uVar3) {
        RangeDec_Decode(p,UVar16,uVar3 - UVar16);
        memset(local_938,0xff,0x100);
        local_938[pbVar22[0xc]] = '\0';
        uVar11 = (uint)p->MinContext->NumStats;
        do {
          local_938[*pbVar13] = '\0';
          pbVar13 = pbVar13 + -6;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
        bVar6 = true;
        local_93c = unaff_EBP;
      }
      else {
        local_93c = 0xfffffffe;
LAB_00189e2e:
        bVar6 = false;
      }
    }
    if (!bVar6) {
      return local_93c;
    }
  }
  do {
    pCVar17 = p->MinContext;
    bVar1 = pCVar17->NumStats;
    uVar11 = p->OrderFall;
    do {
      uVar14 = (ulong)pCVar17->Suffix;
      if (uVar14 == 0) {
        p->OrderFall = uVar11 + 1;
        local_93c = 0xffffffff;
        goto LAB_00189f9f;
      }
      pBVar4 = p->Base;
      pCVar17 = (CPpmd8_Context *)(pBVar4 + uVar14);
      p->MinContext = pCVar17;
      bVar2 = pBVar4[uVar14];
      uVar11 = uVar11 + 1;
    } while (bVar2 == bVar1);
    p->OrderFall = uVar11;
    pbVar13 = pBVar4 + *(uint *)(pBVar4 + uVar14 + 4);
    uVar19 = 0;
    uVar11 = 0;
    do {
      uVar7 = uVar11;
      uVar21 = (uint)local_938[*pbVar13];
      uVar19 = uVar19 + (pbVar13[1] & uVar21);
      local_838[uVar7] = (long)pbVar13;
      pbVar13 = pbVar13 + 6;
      uVar11 = uVar7 - uVar21;
    } while (uVar7 - uVar21 != (uint)bVar2 - (uint)bVar1);
    pCVar10 = Ppmd8_MakeEscFreq(p,(uint)bVar1,&local_940);
    uVar11 = local_940;
    uVar15 = local_940 + uVar19;
    uVar14 = (ulong)p->Range / (ulong)uVar15;
    p->Range = (UInt32)uVar14;
    uVar9 = (uint)(p->Code / uVar14);
    local_940 = uVar15;
    if (uVar9 < uVar19) {
      plVar12 = local_838;
      uVar11 = 0;
      do {
        UVar16 = uVar11;
        pCVar5 = (CPpmd_State *)*plVar12;
        uVar11 = UVar16 + pCVar5->Freq;
        plVar12 = plVar12 + 1;
      } while (uVar11 <= uVar9);
      RangeDec_Decode(p,UVar16,(uint)pCVar5->Freq);
      bVar1 = pCVar10->Shift;
      if (bVar1 < 7) {
        pBVar4 = &pCVar10->Count;
        *pBVar4 = *pBVar4 + 0xff;
        if (*pBVar4 == '\0') {
          pCVar10->Summ = pCVar10->Summ << 1;
          pCVar10->Shift = bVar1 + 1;
          pCVar10->Count = (Byte)(3 << (bVar1 & 0x1f));
        }
      }
      p->FoundState = pCVar5;
      bVar1 = pCVar5->Symbol;
      Ppmd8_Update2(p);
      local_93c = (uint)bVar1;
LAB_00189f9f:
      bVar6 = false;
    }
    else {
      if (uVar15 <= uVar9) {
        local_93c = 0xfffffffe;
        goto LAB_00189f9f;
      }
      RangeDec_Decode(p,uVar19,uVar11);
      pCVar10->Summ = pCVar10->Summ + (short)uVar15;
      iVar8 = uVar21 - uVar7;
      plVar12 = local_838 + (~uVar21 + uVar7);
      do {
        local_938[*(byte *)*plVar12] = '\0';
        plVar12 = plVar12 + -1;
        iVar8 = iVar8 + 1;
      } while (iVar8 != 0);
      bVar6 = true;
    }
    if (!bVar6) {
      return local_93c;
    }
  } while( true );
}

Assistant:

int Ppmd8_DecodeSymbol(CPpmd8 *p)
{
  size_t charMask[256 / sizeof(size_t)];
  if (p->MinContext->NumStats != 0)
  {
    CPpmd_State *s = Ppmd8_GetStats(p, p->MinContext);
    unsigned i;
    UInt32 count, hiCnt;
    if ((count = RangeDec_GetThreshold(p, p->MinContext->SummFreq)) < (hiCnt = s->Freq))
    {
      Byte symbol;
      RangeDec_Decode(p, 0, s->Freq);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd8_Update1_0(p);
      return symbol;
    }
    p->PrevSuccess = 0;
    i = p->MinContext->NumStats;
    do
    {
      if ((hiCnt += (++s)->Freq) > count)
      {
        Byte symbol;
        RangeDec_Decode(p, hiCnt - s->Freq, s->Freq);
        p->FoundState = s;
        symbol = s->Symbol;
        Ppmd8_Update1(p);
        return symbol;
      }
    }
    while (--i);
    if (count >= p->MinContext->SummFreq)
      return -2;
    RangeDec_Decode(p, hiCnt, p->MinContext->SummFreq - hiCnt);
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(s->Symbol) = 0;
    i = p->MinContext->NumStats;
    do { MASK((--s)->Symbol) = 0; } while (--i);
  }
  else
  {
    UInt16 *prob = Ppmd8_GetBinSumm(p);
    if (((p->Code / (p->Range >>= 14)) < *prob))
    {
      Byte symbol;
      RangeDec_Decode(p, 0, *prob);
      *prob = (UInt16)PPMD_UPDATE_PROB_0(*prob);
      symbol = (p->FoundState = Ppmd8Context_OneState(p->MinContext))->Symbol;
      Ppmd8_UpdateBin(p);
      return symbol;
    }
    RangeDec_Decode(p, *prob, (1 << 14) - *prob);
    *prob = (UInt16)PPMD_UPDATE_PROB_1(*prob);
    p->InitEsc = PPMD8_kExpEscape[*prob >> 10];
    PPMD_SetAllBitsIn256Bytes(charMask);
    MASK(Ppmd8Context_OneState(p->MinContext)->Symbol) = 0;
    p->PrevSuccess = 0;
  }
  for (;;)
  {
    CPpmd_State *ps[256], *s;
    UInt32 freqSum, count, hiCnt;
    CPpmd_See *see;
    unsigned i, num, numMasked = p->MinContext->NumStats;
    do
    {
      p->OrderFall++;
      if (!p->MinContext->Suffix)
        return -1;
      p->MinContext = Ppmd8_GetContext(p, p->MinContext->Suffix);
    }
    while (p->MinContext->NumStats == numMasked);
    hiCnt = 0;
    s = Ppmd8_GetStats(p, p->MinContext);
    i = 0;
    num = p->MinContext->NumStats - numMasked;
    do
    {
      int k = (int)(MASK(s->Symbol));
      hiCnt += (s->Freq & k);
      ps[i] = s++;
      i -= k;
    }
    while (i != num);
    
    see = Ppmd8_MakeEscFreq(p, numMasked, &freqSum);
    freqSum += hiCnt;
    count = RangeDec_GetThreshold(p, freqSum);
    
    if (count < hiCnt)
    {
      Byte symbol;
      CPpmd_State **pps = ps;
      for (hiCnt = 0; (hiCnt += (*pps)->Freq) <= count; pps++);
      s = *pps;
      RangeDec_Decode(p, hiCnt - s->Freq, s->Freq);
      Ppmd_See_Update(see);
      p->FoundState = s;
      symbol = s->Symbol;
      Ppmd8_Update2(p);
      return symbol;
    }
    if (count >= freqSum)
      return -2;
    RangeDec_Decode(p, hiCnt, freqSum - hiCnt);
    see->Summ = (UInt16)(see->Summ + freqSum);
    do { MASK(ps[--i]->Symbol) = 0; } while (i != 0);
  }
}